

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O2

void CoreML::Specification::protobuf_NonMaximumSuppression_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_003a71b0 == '\x01') {
    DAT_003a71b0 = '\0';
    (*(code *)*_NonMaximumSuppression_PickTop_default_instance_)();
  }
  if (DAT_003a7228 == '\x01') {
    DAT_003a7228 = 0;
    (*(code *)*_NonMaximumSuppression_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _NonMaximumSuppression_PickTop_default_instance_.Shutdown();
  _NonMaximumSuppression_default_instance_.Shutdown();
}